

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O3

void __thiscall cs::statement_throw::run_impl(statement_throw *this)

{
  char *__s1;
  pointer pcVar1;
  int iVar2;
  undefined *puVar3;
  undefined4 extraout_var;
  string *psVar4;
  lang_error *plVar5;
  runtime_error *this_00;
  var e;
  undefined1 local_40 [8];
  undefined1 local_38 [32];
  
  cs_debugger_step_callback(&this->super_statement_base);
  local_38._0_8_ = (this->mTree).mRoot;
  runtime_type::parse_expr
            ((runtime_type *)local_40,
             (iterator *)
             (((this->super_statement_base).context.
               super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance).
             super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             SUB81(local_38,0));
  if (local_40 == (undefined1  [8])0x0) {
    puVar3 = &void::typeinfo;
  }
  else {
    iVar2 = (*(*(baseHolder **)((long)local_40 + 0x10))->_vptr_baseHolder[2])();
    puVar3 = (undefined *)CONCAT44(extraout_var,iVar2);
  }
  __s1 = *(char **)(puVar3 + 8);
  if (__s1 == "N2cs10lang_errorE") {
LAB_00170c2a:
    psVar4 = (string *)__cxa_allocate_exception(0x20);
    plVar5 = cs_impl::any::const_val<cs::lang_error>((any *)local_40);
    *(string **)psVar4 = psVar4 + 0x10;
    pcVar1 = (plVar5->mWhat)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              (psVar4,pcVar1,pcVar1 + (plVar5->mWhat)._M_string_length);
    __cxa_throw(psVar4,&lang_error::typeinfo,lang_error::~lang_error);
  }
  if (*__s1 != '*') {
    iVar2 = strcmp(__s1,"N2cs10lang_errorE");
    if (iVar2 == 0) goto LAB_00170c2a;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
  local_38._0_8_ = local_38 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,"Throwing unsupported exception.","");
  runtime_error::runtime_error(this_00,(string *)local_38);
  __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

void statement_throw::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		var e = context->instance->parse_expr(this->mTree.root());
		if (e.type() != typeid(lang_error))
			throw runtime_error("Throwing unsupported exception.");
		else
			throw e.const_val<lang_error>();
	}